

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O3

void language::formatConnection
               (QTextStream *str,SignalSlot *sender,SignalSlot *receiver,
               ConnectionSyntax connectionSyntax)

{
  char16_t *pcVar1;
  long lVar2;
  CutResult CVar3;
  QTextStream *pQVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  long local_50;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (_language == 1) {
    local_48.m_data = (sender->signature).d.ptr;
    local_48.m_size = (sender->signature).d.size;
    uVar5 = QStringView::indexOf(&local_48,(QChar)0x28,0,CaseSensitive);
    pcVar1 = (sender->signature).d.ptr;
    uVar8 = (sender->signature).d.size;
    pQVar4 = (QTextStream *)QTextStream::operator<<(str,&sender->name);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,'.');
    uVar7 = uVar5;
    if (uVar8 < uVar5) {
      uVar7 = uVar8;
    }
    QVar10.m_data = pcVar1;
    QVar10.m_size = uVar7;
    QTextStream::operator<<(pQVar4,QVar10);
    if (((sender->options).super_QFlagsStorageHelper<language::SignalSlotOption,_4>.
         super_QFlagsStorage<language::SignalSlotOption>.i & 1) != 0) {
      local_48.m_size = uVar5 + 1;
      local_50 = (uVar8 - uVar5) + -2;
      CVar3 = QtPrivate::QContainerImplHelper::mid(uVar8,&local_48.m_size,&local_50);
      lVar2 = local_50;
      if (local_50 != 0 && CVar3 != Null) {
        pcVar1 = pcVar1 + local_48.m_size;
        local_48.m_size = CONCAT62(local_48.m_size._2_6_,0x2c);
        QVar9.m_data = pcVar1;
        QVar9.m_size = local_50;
        QVar13.m_data = (storage_type_conflict *)&local_48;
        QVar13.m_size = 1;
        lVar6 = QtPrivate::findString(QVar9,0,QVar13,CaseSensitive);
        if (lVar6 == -1) {
          pQVar4 = (QTextStream *)QTextStream::operator<<(str,"[\"");
          QVar11.m_data = pcVar1;
          QVar11.m_size = lVar2;
          pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,QVar11);
          QTextStream::operator<<(pQVar4,"\"]");
        }
      }
    }
    pQVar4 = (QTextStream *)QTextStream::operator<<(str,".connect(");
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,&receiver->name);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,'.');
    pcVar1 = (receiver->signature).d.ptr;
    uVar8 = (receiver->signature).d.size;
    local_48.m_size = uVar8;
    local_48.m_data = pcVar1;
    uVar7 = QStringView::indexOf(&local_48,(QChar)0x28,0,CaseSensitive);
    if (uVar7 <= uVar8) {
      uVar8 = uVar7;
    }
    QVar12.m_data = pcVar1;
    QVar12.m_size = uVar8;
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,QVar12);
    QTextStream::operator<<(pQVar4,')');
  }
  else if (_language == 0) {
    if (connectionSyntax == StringBased) {
      pQVar4 = (QTextStream *)QTextStream::operator<<(str,"QObject::connect(");
      pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,&sender->name);
      pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,", SIGNAL(");
      pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,&sender->signature);
      pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,"), ");
      pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,&receiver->name);
      pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,", SLOT(");
      pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,&receiver->signature);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QTextStream::operator<<(pQVar4,"))");
        return;
      }
      goto LAB_00152bba;
    }
    if (connectionSyntax == MemberFunctionPtr) {
      pQVar4 = (QTextStream *)QTextStream::operator<<(str,"QObject::connect(");
      pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,&sender->name);
      QTextStream::operator<<(pQVar4,", ");
      formatMemberFnPtr(str,sender,Never);
      pQVar4 = (QTextStream *)QTextStream::operator<<(str,", ");
      pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,&receiver->name);
      QTextStream::operator<<(pQVar4,", ");
      formatMemberFnPtr(str,receiver,WhenAmbiguousOrEmpty);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QTextStream::operator<<(str,')');
        return;
      }
      goto LAB_00152bba;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00152bba:
  __stack_chk_fail();
}

Assistant:

void formatConnection(QTextStream &str, const SignalSlot &sender, const SignalSlot &receiver,
                      ConnectionSyntax connectionSyntax)
{
    switch (language()) {
    case Language::Cpp:
        switch (connectionSyntax) {
        case ConnectionSyntax::MemberFunctionPtr:
            formatMemberFnPtrConnection(str, sender, receiver);
            break;
        case ConnectionSyntax::StringBased:
            formatStringBasedConnection(str, sender, receiver);
            break;
        }
        break;
    case Language::Python: {
        const auto paren = sender.signature.indexOf(u'(');
        auto senderSignature = QStringView{sender.signature};
        str << sender.name << '.' << senderSignature.left(paren);
        // Signals like "QAbstractButton::clicked(checked=false)" require
        // the parameter if it is used.
        if (sender.options.testFlag(SignalSlotOption::Ambiguous)) {
            const QStringView parameters =
                senderSignature.mid(paren + 1, senderSignature.size() - paren - 2);
            if (!parameters.isEmpty() && !parameters.contains(u','))
                str << "[\"" << parameters << "\"]";
        }
        str << ".connect(" << receiver.name << '.'
            << QStringView{receiver.signature}.left(receiver.signature.indexOf(u'('))
            << ')';
    }
        break;
    }
}